

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread_unix.cpp
# Opt level: O3

void __thiscall QThreadPrivate::finish(QThreadPrivate *this)

{
  QMutex *this_00;
  __pointer_type copy;
  QThreadPrivate *d;
  bool bVar1;
  
  pthread_setcancelstate(1,(int *)0x0);
  this_00 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar1 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar1) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar1) goto LAB_003c0e97;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_003c0e97:
  this->threadState = Finishing;
  LOCK();
  copy = (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
  }
  QThread::finished();
  QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
  QThreadStoragePrivate::finish(&this->data->tls);
  return;
}

Assistant:

void QThreadPrivate::finish()
{
    terminate_on_exception([&] {
        QThreadPrivate *d = this;
        QThread *thr = q_func();

        // Disable cancellation; we're already in the finishing touches of this
        // thread, and we don't want cleanup to be disturbed by
        // abi::__forced_unwind being thrown from all kinds of functions.
#ifdef PTHREAD_CANCEL_DISABLE
        pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, nullptr);
#endif

        QMutexLocker locker(&d->mutex);

        d->threadState = QThreadPrivate::Finishing;
        locker.unlock();
        emit thr->finished(QThread::QPrivateSignal());
        QCoreApplication::sendPostedEvents(nullptr, QEvent::DeferredDelete);

        QThreadStoragePrivate::finish(&d->data->tls);
    });

    if constexpr (QT_CONFIG(broken_threadlocal_dtors))
        cleanup();
}